

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.hpp
# Opt level: O2

enable_if_t<std::is_unsigned<unsigned_char>::value,_unsigned_char>
burst::divceil<unsigned_char,unsigned_short>
          (Integer<unsigned_char> n,Integer<unsigned_short> divisor)

{
  enable_if_t<std::is_unsigned<unsigned_char>::value,_unsigned_char> eVar1;
  domain_error *this;
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,divisor) != 0) {
    if (n == '\0') {
      eVar1 = '\0';
    }
    else {
      eVar1 = (char)((n - 1 & 0xffff) / (uint)divisor) + '\x01';
    }
    return eVar1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,anon_var_dwarf_1fcf7);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr auto divceil (Integer<I> n, Integer<J> divisor)
    {
        if (divisor > 0)
        {
            return detail::divceil_impl(n, divisor);
        }
        else
        {
            throw std::domain_error("Целая часть от деления на неположительное число не определена.");
        }
    }